

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonlinear_beamformer.cc
# Opt level: O3

void __thiscall
webrtc::NonlinearBeamformer::AimAt(NonlinearBeamformer *this,SphericalPointf *target_direction)

{
  this->target_angle_radians_ = target_direction->s[0];
  InitHighFrequencyCorrectionRanges(this);
  InitInterfAngles(this);
  InitDelaySumMasks(this);
  InitTargetCovMats(this);
  InitInterfCovMats(this);
  NormalizeCovMats(this);
  return;
}

Assistant:

void NonlinearBeamformer::AimAt(const SphericalPointf& target_direction) {
  target_angle_radians_ = target_direction.azimuth();
  InitHighFrequencyCorrectionRanges();
  InitInterfAngles();
  InitDelaySumMasks();
  InitTargetCovMats();
  InitInterfCovMats();
  NormalizeCovMats();
}